

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTreeClauseVariantIndex::insert
          (SubstitutionTreeClauseVariantIndex *this,Clause *cl)

{
  ZIArray<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *this_00;
  ClauseList *pCVar1;
  List<Kernel::Clause_*> *pLVar2;
  int iVar3;
  ClauseList *pCVar4;
  List<Kernel::Clause_*> *pLVar5;
  LiteralSubstitutionTree<Indexing::LiteralClause> *pLVar6;
  Literal *pLVar7;
  uint uVar8;
  Literal *pLVar9;
  uint length;
  SubstitutionTreeClauseVariantIndex *this_01;
  uint uVar10;
  ulong n;
  ClauseList **plist;
  List<Kernel::Clause_*> *local_40;
  List<Kernel::Clause_*> **local_38;
  
  uVar10 = (uint)*(ulong *)&cl->field_0x38;
  length = uVar10 & 0xfffff;
  if (length == 1) {
    pLVar7 = cl->_literals[0];
    iVar3 = 0;
    pLVar9 = pLVar7;
    if (*(int *)&(pLVar7->super_Term).field_0xc < 0) {
      iVar3 = 0;
      do {
        pLVar9 = *(Literal **)&(pLVar9->super_Term).field_9._vars;
        if (((ulong)pLVar9 & 1) != 0) {
          uVar8 = 3;
          goto LAB_002bb60e;
        }
        iVar3 = iVar3 + 2;
      } while (*(int *)&(pLVar9->super_Term).field_0xc < 0);
    }
    uVar8 = (pLVar9->super_Term).field_9._vars;
LAB_002bb60e:
    if (iVar3 + uVar8 != 0) goto LAB_002bb661;
    local_40 = (List<Kernel::Clause_*> *)0x0;
    Lib::
    DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
    getValuePtr(&this->_groundUnits,pLVar7,&local_38,&local_40);
    pLVar2 = *local_38;
    pLVar5 = (List<Kernel::Clause_*> *)
             Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pLVar5->_head = cl;
    pLVar5->_tail = pLVar2;
    *local_38 = pLVar5;
  }
  else {
    if ((*(ulong *)&cl->field_0x38 & 0xfffff) != 0) {
LAB_002bb661:
      this_00 = &this->_strees;
      n = (ulong)(uVar10 & 0xfffff);
      this_01 = this;
      if ((this->_strees).super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
          _capacity <= n) {
        this_01 = (SubstitutionTreeClauseVariantIndex *)this_00;
        Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::expandToFit
                  (&this_00->
                    super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,n);
      }
      if ((this->_strees).super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
          _array[n] == (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
        pLVar6 = (LiteralSubstitutionTree<Indexing::LiteralClause> *)::operator_new(0x28);
        (pLVar6->super_LiteralIndexingStructure<Indexing::LiteralClause>).
        _vptr_LiteralIndexingStructure = (_func_int **)&PTR__LiteralSubstitutionTree_00b285e0;
        this_01 = (SubstitutionTreeClauseVariantIndex *)&pLVar6->_trees;
        Lib::
        Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
        ::Stack((Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
                 *)this_01,
                (ulong)((uint)((ulong)(*(long *)(DAT_00b521b0 + 0x88) -
                                      *(long *)(DAT_00b521b0 + 0x80)) >> 2) & 0xfffffffe));
        if ((this->_strees).
            super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>._capacity <= n
           ) {
          this_01 = (SubstitutionTreeClauseVariantIndex *)this_00;
          Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::expandToFit
                    (&this_00->
                      super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,n);
        }
        (this->_strees).super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
        _array[n] = pLVar6;
      }
      pLVar7 = getMainLiteral(this_01,cl->_literals,length);
      if ((this->_strees).super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
          _capacity <= n) {
        Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::expandToFit
                  (&this_00->
                    super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,n);
      }
      pLVar6 = (this->_strees).
               super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>._array[n];
      (*(pLVar6->super_LiteralIndexingStructure<Indexing::LiteralClause>).
        _vptr_LiteralIndexingStructure[2])(pLVar6,pLVar7,cl,1);
      return;
    }
    pCVar1 = this->_emptyClauses;
    pCVar4 = (ClauseList *)
             Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pCVar4->_head = cl;
    pCVar4->_tail = pCVar1;
    this->_emptyClauses = pCVar4;
  }
  return;
}

Assistant:

void SubstitutionTreeClauseVariantIndex::insert(Clause* cl)
{
  unsigned clen=cl->length();

  if(cl->length()==0) {
    ClauseList::push(cl, _emptyClauses);
    return;
  }
  if(cl->length()==1 && (*cl)[0]->ground()) {
    Literal* lit=(*cl)[0];
    ClauseList** plist;
    _groundUnits.getValuePtr(lit, plist,0);
    ClauseList::push(cl, *plist);
    return;
  }

  if(!_strees[clen]) {
    _strees[clen] = new LiteralSubstitutionTree();
  }
  Literal* mainLit=getMainLiteral(cl->literals(), clen);
  _strees[clen]->insert(LiteralClause{ mainLit, cl });
}